

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testCaseEnded(ConsoleReporter *this,TestCaseStats *_testCaseStats)

{
  pointer this_00;
  TestCaseStats *pTVar1;
  TestCaseStats *_testCaseStats_local;
  ConsoleReporter *this_local;
  
  pTVar1 = _testCaseStats;
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->(&this->m_tablePrinter);
  TablePrinter::close(this_00,(int)pTVar1);
  StreamingReporterBase<Catch::ConsoleReporter>::testCaseEnded
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,_testCaseStats);
  this->m_headerPrinted = false;
  return;
}

Assistant:

void ConsoleReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
    m_tablePrinter->close();
    StreamingReporterBase::testCaseEnded(_testCaseStats);
    m_headerPrinted = false;
}